

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<std::tuple<int,double>,std::tuple<int,double>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<int,_double> *expected,tuple<int,_double> *actual)

{
  tuple<int,_double> *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_60;
  string local_40;
  
  PrintToString<std::tuple<int,double>>
            (&local_40,(testing *)expected,(tuple<int,_double> *)actual_expression);
  PrintToString<std::tuple<int,double>>(&local_60,(testing *)actual,value);
  EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* expected_expression,
                                   const char* actual_expression,
                                   const T1& expected, const T2& actual) {
  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}